

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<Fad<double>_>::TPZVec(TPZVec<Fad<double>_> *this,int64_t size,Fad<double> *copy)

{
  int64_t *piVar1;
  Fad<double> *this_00;
  long lVar2;
  bool bVar3;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_01656378;
  this->fStore = (Fad<double> *)0x0;
  if (size < 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZVec<Fad<double>>::TPZVec(const int64_t, const T &) [TVar = Fad<double>]");
    std::operator<<((ostream *)&std::cerr,"Bad parameter size, then size = 0.\n");
    std::ostream::flush();
    this->fNElements = 0;
    this->fNAlloc = 0;
  }
  else {
    if (size != 0) {
      lVar2 = 0;
      piVar1 = (int64_t *)operator_new__(-(ulong)((ulong)size >> 0x3b != 0) | size * 0x20 | 8);
      *piVar1 = size;
      this_00 = (Fad<double> *)(piVar1 + 1);
      do {
        Fad<double>::Fad(this_00);
        lVar2 = lVar2 + -0x20;
        this_00 = this_00 + 1;
      } while (-lVar2 != size * 0x20);
      this->fStore = (Fad<double> *)(piVar1 + 1);
    }
    this->fNElements = size;
    this->fNAlloc = size;
    lVar2 = 0;
    while (bVar3 = size != 0, size = size + -1, bVar3) {
      Fad<double>::operator=((Fad<double> *)((long)&this->fStore->val_ + lVar2),copy);
      lVar2 = lVar2 + 0x20;
    }
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size, const T& copy ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	if( size )
	{
		fStore = new T[size];
	}
	
	fNElements = size;
    fNAlloc = size;
	
	for( int64_t i = 0; i < size; i++ )
	{
		fStore[i] = copy;
	}
}